

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  int *piVar1;
  xmlChar *pxVar2;
  int iVar3;
  xmlRelaxNGValidStatePtr pxVar4;
  xmlChar *pxVar5;
  xmlAttrPtr in_RDX;
  xmlAttrPtr extraout_RDX;
  xmlNodePtr pxVar6;
  xmlChar *pxVar7;
  xmlRelaxNGDefinePtr pxVar8;
  ulong local_40;
  xmlNodePtr local_38;
  
  iVar3 = -1;
  if (0 < ctxt->state->nbAttrLeft) {
    pxVar4 = ctxt->state;
    if (define->name == (xmlChar *)0x0) {
      if (pxVar4->nbAttrs < 1) {
        local_40 = 0;
        pxVar6 = (xmlNodePtr)0x0;
      }
      else {
        local_40 = 0;
        do {
          pxVar6 = (xmlNodePtr)pxVar4->attrs[local_40];
          if ((pxVar6 != (xmlNodePtr)0x0) &&
             (iVar3 = xmlRelaxNGAttributeMatch
                                ((xmlRelaxNGValidCtxtPtr)define,(xmlRelaxNGDefinePtr_conflict)pxVar6
                                 ,in_RDX), in_RDX = extraout_RDX, iVar3 == 1)) goto LAB_0018c6f4;
          local_40 = local_40 + 1;
          pxVar4 = ctxt->state;
        } while ((long)local_40 < (long)pxVar4->nbAttrs);
        pxVar6 = (xmlNodePtr)0x0;
LAB_0018c6f4:
        local_40 = local_40 & 0xffffffff;
      }
      if (pxVar6 == (xmlNodePtr)0x0) {
        return -1;
      }
      pxVar5 = xmlNodeListGetString(pxVar6->doc,pxVar6->children,1);
      pxVar4 = ctxt->state;
      local_38 = pxVar4->seq;
      pxVar7 = pxVar4->value;
      pxVar4->seq = pxVar6;
      pxVar4->value = pxVar5;
      pxVar8 = define->content;
      while ((iVar3 = 0, pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
             (iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar8), iVar3 == 0))) {
        pxVar8 = pxVar8->next;
      }
    }
    else {
      if (pxVar4->nbAttrs < 1) {
        local_40 = 0;
        pxVar6 = (xmlNodePtr)0x0;
      }
      else {
        local_40 = 0;
        do {
          pxVar6 = (xmlNodePtr)pxVar4->attrs[local_40];
          if (((pxVar6 != (xmlNodePtr)0x0) &&
              (iVar3 = xmlStrEqual(define->name,pxVar6->name), iVar3 != 0)) &&
             ((((pxVar7 = define->ns, pxVar7 == (xmlChar *)0x0 || (*pxVar7 == '\0')) &&
               (pxVar6->ns == (xmlNs *)0x0)) ||
              ((pxVar6->ns != (xmlNs *)0x0 &&
               (iVar3 = xmlStrEqual(pxVar7,pxVar6->ns->href), iVar3 != 0)))))) goto LAB_0018c6af;
          local_40 = local_40 + 1;
          pxVar4 = ctxt->state;
        } while ((long)local_40 < (long)pxVar4->nbAttrs);
        pxVar6 = (xmlNodePtr)0x0;
LAB_0018c6af:
        local_40 = local_40 & 0xffffffff;
      }
      if (pxVar6 == (xmlNodePtr)0x0) {
        return -1;
      }
      pxVar5 = xmlNodeListGetString(pxVar6->doc,pxVar6->children,1);
      pxVar4 = ctxt->state;
      local_38 = pxVar4->seq;
      pxVar7 = pxVar4->value;
      pxVar4->seq = pxVar6;
      pxVar4->value = pxVar5;
      pxVar4->endvalue = (xmlChar *)0x0;
      pxVar8 = define->content;
      while ((iVar3 = 0, pxVar8 != (xmlRelaxNGDefinePtr_conflict)0x0 &&
             (iVar3 = xmlRelaxNGValidateValue(ctxt,pxVar8), iVar3 == 0))) {
        pxVar8 = pxVar8->next;
      }
    }
    pxVar2 = ctxt->state->value;
    if (pxVar2 != (xmlChar *)0x0) {
      pxVar5 = pxVar2;
    }
    if (pxVar5 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar5);
    }
    pxVar4 = ctxt->state;
    pxVar4->value = pxVar7;
    pxVar4->seq = local_38;
    if (iVar3 == 0) {
      pxVar4->attrs[local_40] = (xmlAttrPtr)0x0;
      piVar1 = &ctxt->state->nbAttrLeft;
      *piVar1 = *piVar1 + -1;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
xmlRelaxNGValidateAttribute(xmlRelaxNGValidCtxtPtr ctxt,
                            xmlRelaxNGDefinePtr define)
{
    int ret = 0, i;
    xmlChar *value, *oldvalue;
    xmlAttrPtr prop = NULL, tmp;
    xmlNodePtr oldseq;

    if (ctxt->state->nbAttrLeft <= 0)
        return (-1);
    if (define->name != NULL) {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) && (xmlStrEqual(define->name, tmp->name))) {
                if ((((define->ns == NULL) || (define->ns[0] == 0)) &&
                     (tmp->ns == NULL)) ||
                    ((tmp->ns != NULL) &&
                     (xmlStrEqual(define->ns, tmp->ns->href)))) {
                    prop = tmp;
                    break;
                }
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ctxt->state->endvalue = NULL;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
    } else {
        for (i = 0; i < ctxt->state->nbAttrs; i++) {
            tmp = ctxt->state->attrs[i];
            if ((tmp != NULL) &&
                (xmlRelaxNGAttributeMatch(ctxt, define, tmp) == 1)) {
                prop = tmp;
                break;
            }
        }
        if (prop != NULL) {
            value = xmlNodeListGetString(prop->doc, prop->children, 1);
            oldvalue = ctxt->state->value;
            oldseq = ctxt->state->seq;
            ctxt->state->seq = (xmlNodePtr) prop;
            ctxt->state->value = value;
            ret = xmlRelaxNGValidateValueContent(ctxt, define->content);
            if (ctxt->state->value != NULL)
                value = ctxt->state->value;
            if (value != NULL)
                xmlFree(value);
            ctxt->state->value = oldvalue;
            ctxt->state->seq = oldseq;
            if (ret == 0) {
                /*
                 * flag the attribute as processed
                 */
                ctxt->state->attrs[i] = NULL;
                ctxt->state->nbAttrLeft--;
            }
        } else {
            ret = -1;
        }
    }

    return (ret);
}